

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

float Amap_CutAreaRef(Amap_Man_t *p,Amap_Mat_t *pM)

{
  char cVar1;
  ushort uVar2;
  Amap_Cut_t AVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  uint uVar8;
  Amap_Cut_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  
  uVar2 = *(ushort *)&pM->pSet->field_0x8;
  pVVar5 = p->pLib->vGates;
  if ((int)(uint)uVar2 < pVVar5->nSize) {
    fVar13 = (float)*(double *)((long)pVVar5->pArray[uVar2] + 0x20);
    pAVar9 = pM->pCut;
    if (0x1ffff < (uint)*pAVar9) {
      uVar12 = 0;
      do {
        cVar1 = pM->pSet->Ins[uVar12];
        if ((cVar1 < '\0') || (AVar3 = pAVar9[(ulong)((uint)(int)cVar1 >> 1) + 1], (int)AVar3 < 0))
        {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (p->vObjs->nSize <= (int)((uint)AVar3 >> 1)) goto LAB_00441975;
        puVar6 = (undefined8 *)p->vObjs->pArray[(uint)AVar3 >> 1];
        if (*(int *)(puVar6 + 7) + *(int *)((long)puVar6 + 0x34) < 0) {
          __assert_fail("Amap_ObjRefsTotal(pFanin) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                        ,0x16e,"float Amap_CutAreaRef(Amap_Man_t *, Amap_Mat_t *)");
        }
        uVar8 = (int)cVar1 & 1;
        uVar11 = (uint)AVar3 & 1 ^ uVar8;
        uVar7 = *puVar6;
        uVar10 = (ulong)uVar11;
        if ((uVar11 != -(int)((long)uVar7 >> 0x3f)) &&
           (*(int *)((long)puVar6 + uVar10 * 4 + 0x34) == 0)) {
          fVar13 = fVar13 + p->fAreaInv;
        }
        iVar4 = *(int *)((long)puVar6 + uVar10 * 4 + 0x34);
        *(int *)((long)puVar6 + uVar10 * 4 + 0x34) = iVar4 + 1;
        if ((iVar4 + *(int *)((long)puVar6 + (ulong)(uVar8 == ((uint)AVar3 & 1)) * 4 + 0x34) == 0)
           && (uVar8 = (uint)uVar7, (uVar8 & 6) == 4 || (uVar8 & 7) == 6)) {
          fVar14 = Amap_CutAreaRef(p,(Amap_Mat_t *)(puVar6 + 8));
          fVar13 = fVar13 + fVar14;
        }
        uVar12 = uVar12 + 1;
        pAVar9 = pM->pCut;
      } while (uVar12 < (uint)*pAVar9 >> 0x11);
    }
    return fVar13;
  }
LAB_00441975:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline float Amap_CutAreaRef( Amap_Man_t * p, Amap_Mat_t * pM )
{
    Amap_Obj_t * pFanin;
    int i, fCompl;
    float Area = Amap_LibGate( p->pLib, pM->pSet->iGate )->dArea;
    Amap_MatchForEachFaninCompl( p, pM, pFanin, fCompl, i )
    {
        assert( Amap_ObjRefsTotal(pFanin) >= 0 );
        if ( (int)pFanin->fPolar != fCompl && pFanin->nFouts[fCompl] == 0 )
            Area += p->fAreaInv;
        if ( pFanin->nFouts[fCompl]++ + pFanin->nFouts[!fCompl] == 0 && Amap_ObjIsNode(pFanin) )
            Area += Amap_CutAreaRef( p, &pFanin->Best );
    }
    return Area;
}